

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fnv.cpp
# Opt level: O2

void __thiscall Fnv_StandardVectors_Test::TestBody(Fnv_StandardVectors_Test *this)

{
  uchar *first;
  unsigned_long *in_RCX;
  pointer *__ptr;
  char *message;
  long lVar1;
  int iVar2;
  span<const_unsigned_char,__1L> sVar3;
  span<const_unsigned_char,__1L> buf;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  uint64_t hval;
  
  iVar2 = 1;
  for (lVar1 = 0; first = *(uchar **)((long)&(anonymous_namespace)::fnv_test_str + lVar1),
      first != (uchar *)0x0; lVar1 = lVar1 + 0x10) {
    sVar3 = pstore::gsl::make_span<unsigned_char_const>
                      (first,first + *(long *)((long)&DAT_0020fce8 + lVar1));
    buf.storage_.data_ = (pointer)0xcbf29ce484222325;
    buf.storage_.super_extent_type<_1L>.size_ = (index_type)sVar3.storage_.data_;
    hval = pstore::fnv_64a_buf<unsigned_char_const,_1l>
                     ((pstore *)sVar3.storage_.super_extent_type<_1L>.size_.size_,buf,
                      (uint64_t)in_RCX);
    in_RCX = &hval;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"hval","fnv1a_64_vector[test_num - 1].fnv1a_64",&hval,
               (unsigned_long *)((anonymous_namespace)::fnv1a_64_vector + lVar1 + 8));
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_58);
      std::operator<<((ostream *)(local_58._M_head_impl + 0x10),"failed test # ");
      std::ostream::operator<<(local_58._M_head_impl + 0x10,iVar2);
      message = anon_var_dwarf_73ef0 + 0x50;
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      in_RCX = (unsigned_long *)0x220;
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_fnv.cpp"
                 ,0x220,message);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

TEST (Fnv, StandardVectors) {
    auto test_num = 1; // test vector that failed, starting at 1.
    for (test_vector const * t = fnv_test_str; t->buf != nullptr; ++t, ++test_num) {
        auto const * const first = reinterpret_cast<std::uint8_t const *> (t->buf);
        std::uint64_t const hval = pstore::fnv_64a_buf (
            pstore::gsl::make_span (first, first + t->len));
        EXPECT_EQ (hval, fnv1a_64_vector[test_num - 1].fnv1a_64) << "failed test # " << test_num;
    }
}